

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

void doFormatString<std::__cxx11::wstring_const,std::__cxx11::wstring,unsigned_long>
               (wstringstream *stream,wchar_t *format,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *first,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *rest,
               unsigned_long *rest_1)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *local_38;
  
  while( true ) {
    wVar1 = *format;
    if (wVar1 == L'\0') {
      return;
    }
    if (wVar1 == L'%') break;
    std::operator<<((wostream *)(stream + 0x10),wVar1);
    format = format + 1;
  }
  local_38 = format + 1;
  bVar2 = doFormatSetup(stream,&local_38);
  if (bVar2) {
    std::operator<<((wostream *)(stream + 0x10),(wstring *)first);
  }
  doFormatString<std::__cxx11::wstring_const,unsigned_long>(stream,local_38,rest,rest_1);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}